

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  secp256k1_ge *a_local;
  secp256k1_ge *r_local;
  
  memcpy(r,a,0x58);
  secp256k1_fe_normalize_weak(&r->y);
  secp256k1_fe_negate(&r->y,&r->y,1);
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
}